

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::SwapchainBuilder::add_desired_present_modes
          (SwapchainBuilder *this,vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *modes
          )

{
  value_type local_20 [2];
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *local_18;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *modes_local;
  SwapchainBuilder *this_local;
  
  local_20[1] = 1;
  local_18 = modes;
  modes_local = (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)this;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back(modes,local_20 + 1);
  local_20[0] = VK_PRESENT_MODE_FIFO_KHR;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back(local_18,local_20);
  return;
}

Assistant:

void SwapchainBuilder::add_desired_present_modes(std::vector<VkPresentModeKHR>& modes) const {
    modes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
    modes.push_back(VK_PRESENT_MODE_FIFO_KHR);
}